

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

int luaV_lessthan(lua_State *L,TValue *l,TValue *r)

{
  uint uVar1;
  int iVar2;
  
  if (l->tt_ == 3) {
    if (r->tt_ == 3) {
      return (uint)((l->value_).n <= (r->value_).n && (r->value_).n != (l->value_).n);
    }
  }
  else if (((l->tt_ & 0xfU) == 4) && ((r->tt_ & 0xfU) == 4)) {
    uVar1 = l_strcmp(&((l->value_).gc)->ts,&((r->value_).gc)->ts);
    return uVar1 >> 0x1f;
  }
  iVar2 = call_orderTM(L,l,r,TM_LT);
  if (-1 < iVar2) {
    return iVar2;
  }
  luaG_ordererror(L,l,r);
}

Assistant:

int luaV_lessthan (lua_State *L, const TValue *l, const TValue *r) {
  int res;
  if (ttisnumber(l) && ttisnumber(r))
    return luai_numlt(L, nvalue(l), nvalue(r));
  else if (ttisstring(l) && ttisstring(r))
    return l_strcmp(rawtsvalue(l), rawtsvalue(r)) < 0;
  else if ((res = call_orderTM(L, l, r, TM_LT)) < 0)
    luaG_ordererror(L, l, r);
  return res;
}